

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMakeArrayNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t slotCount;
  anon_struct_40_5_779576b2 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_88;
  ulong uStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  local_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sVar1 = *arguments;
  uStack_80 = *(ulong *)(sVar1 + 0x28);
  if (((uStack_80 & 0xf) == 0 && uStack_80 != 0) && (7 < *(uint *)(uStack_80 + 0xc))) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uStack_80 + 0xc) >> 3);
  }
  else {
    if (*(long *)(sVar1 + 0x20) != 0) {
      sysbvm_stackFrame_popRecord(&local_60);
      sysbvm_stackFrame_popRecord(&local_48);
      return *arguments;
    }
    slotCount = 0;
  }
  local_88 = sysbvm_context_shallowCopy(context,sVar1);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x18) = sVar1;
  local_78 = sysbvm_array_create(context,slotCount);
  if (slotCount != 0) {
    sVar1 = 0;
    do {
      if ((uStack_80 & 0xf) == 0 && uStack_80 != 0) {
        sStack_70 = *(sysbvm_tuple_t *)(uStack_80 + 0x10 + sVar1 * 8);
      }
      else {
        sStack_70 = 0;
      }
      local_68 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                           (context,sStack_70,0,arguments[1]);
      if ((local_78 & 0xf) == 0 && local_78 != 0) {
        *(sysbvm_tuple_t *)(local_78 + 0x10 + sVar1 * 8) = local_68;
      }
      sVar1 = sVar1 + 1;
    } while (slotCount != sVar1);
  }
  *(sysbvm_tuple_t *)(local_88 + 0x20) = (context->roots).arrayType;
  *(sysbvm_tuple_t *)(local_88 + 0x28) = local_78;
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeArrayNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeArrayNode_t **tupleNode = (sysbvm_astMakeArrayNode_t**)node;

    struct {
        sysbvm_astMakeArrayNode_t *analyzedTupleNode;
        sysbvm_tuple_t expressions;
        sysbvm_tuple_t analyzedExpressions;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t analyzedExpression;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*tupleNode)->super.sourcePosition);

    gcFrame.expressions = (*tupleNode)->elements;
    size_t expressionCount = sysbvm_array_getSize(gcFrame.expressions);
    if(expressionCount == 0 && (*tupleNode)->super.analyzedType)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return *node;
    }

    gcFrame.analyzedTupleNode = (sysbvm_astMakeArrayNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedTupleNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    
    gcFrame.analyzedExpressions = sysbvm_array_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at(gcFrame.expressions, i);
        gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.expression, *environment);
        sysbvm_array_atPut(gcFrame.analyzedExpressions, i, gcFrame.analyzedExpression);
    }

    gcFrame.analyzedTupleNode->super.analyzedType = context->roots.arrayType;
    gcFrame.analyzedTupleNode->elements = gcFrame.analyzedExpressions;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedTupleNode;
}